

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboCompletenessTests.hpp
# Opt level: O0

void __thiscall
deqp::gls::fboc::details::ParamTest<deqp::gls::fboc::details::AttachmentParams>::ParamTest
          (ParamTest<deqp::gls::fboc::details::AttachmentParams> *this,Context *ctx,Params *params)

{
  GLenum GVar1;
  AttachmentParams *params_00;
  string local_60;
  string local_40;
  AttachmentParams *local_20;
  Params *params_local;
  Context *ctx_local;
  ParamTest<deqp::gls::fboc::details::AttachmentParams> *this_local;
  
  local_20 = params;
  params_local = (Params *)ctx;
  ctx_local = (Context *)this;
  AttachmentParams::getName_abi_cxx11_(&local_40,params,params);
  AttachmentParams::getDescription_abi_cxx11_(&local_60,local_20,params_00);
  TestBase::TestBase(&this->super_TestBase,ctx,&local_40,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  (this->super_TestBase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ParamTest_015c93b0;
  GVar1 = local_20->colornKind;
  (this->m_params).color0Kind = local_20->color0Kind;
  (this->m_params).colornKind = GVar1;
  GVar1 = local_20->stencilKind;
  (this->m_params).depthKind = local_20->depthKind;
  (this->m_params).stencilKind = GVar1;
  return;
}

Assistant:

ParamTest		(Context& ctx, const Params& params)
					: TestBase	(ctx, Params::getName(params), Params::getDescription(params))
					, m_params	(params) {}